

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::ConfidentialTransactionContext::AddPegoutTxOut
          (ConfidentialTransactionContext *this,Amount *value,ConfidentialAssetId *asset,
          BlockHash *genesisblock_hash,Address *btc_address,NetType bitcoin_net_type,
          Pubkey *online_pubkey,Privkey *master_online_key,string *btc_descriptor,
          uint32_t bip32_counter,ByteData *whitelist,NetType elements_net_type,
          Address *btc_derive_address)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  BlockHash *in_RCX;
  ConfidentialAssetId *in_RDX;
  Amount *in_RSI;
  ConfidentialTransaction *in_RDI;
  Address *in_R8;
  NetType in_R9D;
  Pubkey *in_stack_00000008;
  Privkey *in_stack_00000010;
  string *in_stack_00000018;
  uint32_t in_stack_00000020;
  ByteData *in_stack_00000028;
  NetType in_stack_00000030;
  Address *in_stack_00000038;
  Script locking_script;
  Address derive_addr;
  PegoutKeyData key_data;
  Script script;
  undefined4 in_stack_fffffffffffffc6c;
  Address *in_stack_fffffffffffffc70;
  Script local_338;
  Script local_300;
  Script local_2c8;
  string local_290;
  undefined1 local_270 [72];
  Address local_228;
  PegoutKeyData local_98;
  Script local_68;
  NetType local_2c;
  Address *local_28;
  BlockHash *local_20;
  ConfidentialAssetId *local_18;
  Amount *local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  core::Script::Script(&local_68);
  core::PegoutKeyData::PegoutKeyData(&local_98);
  bVar1 = core::Pubkey::IsValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = core::Privkey::IsValid(in_stack_00000010), bVar1)) {
    core::Address::Address(&local_228);
    core::ByteData::ByteData((ByteData *)local_270);
    in_stack_fffffffffffffc70 = (Address *)local_270;
    core::ConfidentialTransaction::GetPegoutPubkeyData
              ((PegoutKeyData *)(local_270 + 0x18),in_stack_00000008,in_stack_00000010,
               in_stack_00000018,in_stack_00000020,in_stack_00000028,local_2c,
               (ByteData *)in_stack_fffffffffffffc70,in_stack_00000030,&local_228);
    core::PegoutKeyData::operator=
              ((PegoutKeyData *)in_stack_fffffffffffffc70,
               (PegoutKeyData *)CONCAT44(in_stack_fffffffffffffc6c,local_2c));
    core::PegoutKeyData::~PegoutKeyData((PegoutKeyData *)(local_270 + 0x18));
    core::ByteData::~ByteData((ByteData *)0x57dbd4);
    core::Address::GetAddress_abi_cxx11_(&local_290,&local_228);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_290);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      core::Address::GetLockingScript(&local_2c8,&local_228);
      core::Script::operator=(&local_68,&local_2c8);
      core::Script::~Script((Script *)in_stack_fffffffffffffc70);
      if (in_stack_00000038 != (Address *)0x0) {
        core::Address::operator=(in_stack_00000038,&local_228);
      }
    }
    core::Address::~Address(in_stack_fffffffffffffc70);
  }
  else {
    core::Address::GetLockingScript(&local_300,local_28);
    core::Script::operator=(&local_68,&local_300);
    core::Script::~Script((Script *)in_stack_fffffffffffffc70);
  }
  core::ScriptUtil::CreatePegoutLogkingScript
            (&local_338,local_20,&local_68,&local_98.btc_pubkey_bytes,&local_98.whitelist_proof);
  uVar3 = core::ConfidentialTransaction::AddTxOut(in_RDI,local_10,local_18,&local_338);
  core::Script::~Script((Script *)in_stack_fffffffffffffc70);
  core::PegoutKeyData::~PegoutKeyData(&local_98);
  core::Script::~Script((Script *)in_stack_fffffffffffffc70);
  return uVar3;
}

Assistant:

uint32_t ConfidentialTransactionContext::AddPegoutTxOut(
    const Amount& value, const ConfidentialAssetId& asset,
    const BlockHash& genesisblock_hash, const Address& btc_address,
    NetType bitcoin_net_type, const Pubkey& online_pubkey,
    const Privkey& master_online_key, const std::string& btc_descriptor,
    uint32_t bip32_counter, const ByteData& whitelist,
    NetType elements_net_type, Address* btc_derive_address) {
  Script script;
  PegoutKeyData key_data;
  if (online_pubkey.IsValid() && master_online_key.IsValid()) {
    // generate pubkey and whitelistproof
    Address derive_addr;
    key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, btc_descriptor, bip32_counter,
        whitelist, bitcoin_net_type, ByteData(), elements_net_type,
        &derive_addr);
    if (!derive_addr.GetAddress().empty()) {
      script = derive_addr.GetLockingScript();
      if (btc_derive_address != nullptr) {
        *btc_derive_address = derive_addr;
      }
    }
  } else {
    script = btc_address.GetLockingScript();
  }

  Script locking_script = ScriptUtil::CreatePegoutLogkingScript(
      genesisblock_hash, script, key_data.btc_pubkey_bytes,
      key_data.whitelist_proof);
  return AddTxOut(value, asset, locking_script);
}